

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O0

gdImagePtr gdImageCreateFromGifPtr(int size,void *data)

{
  gdIOCtx *fd;
  gdIOCtx *in;
  gdImagePtr im;
  void *data_local;
  gdImagePtr pgStack_10;
  int size_local;
  
  fd = gdNewDynamicCtxEx(size,data,0);
  if (fd == (gdIOCtx *)0x0) {
    pgStack_10 = (gdImagePtr)0x0;
  }
  else {
    pgStack_10 = gdImageCreateFromGifCtx(fd);
    (*fd->gd_free)(fd);
  }
  return pgStack_10;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGifPtr (int size, void *data)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewDynamicCtxEx(size, data, 0);
	if(!in) {
		return 0;
	}
	im = gdImageCreateFromGifCtx(in);
	in->gd_free(in);
	return im;
}